

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_group_element_jacobian_test(secp256k1_gej *gej,secp256k1_ge *ge)

{
  long in_RSI;
  long in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_fe *in_stack_ffffffffffffff90;
  
  random_fe_non_zero_test((secp256k1_fe *)0x140bbc);
  secp256k1_fe_sqr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x140be7);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x140bfb);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x140c17);
  *(undefined4 *)(in_RDI + 0x90) = *(undefined4 *)(in_RSI + 0x60);
  return;
}

Assistant:

static void random_group_element_jacobian_test(secp256k1_gej *gej, const secp256k1_ge *ge) {
    secp256k1_fe z2, z3;
    random_fe_non_zero_test(&gej->z);
    secp256k1_fe_sqr(&z2, &gej->z);
    secp256k1_fe_mul(&z3, &z2, &gej->z);
    secp256k1_fe_mul(&gej->x, &ge->x, &z2);
    secp256k1_fe_mul(&gej->y, &ge->y, &z3);
    gej->infinity = ge->infinity;
}